

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Box.hpp
# Opt level: O2

void __thiscall Box::draw(Box *this,mat4 *projection,mat4 *view,vec3 *eye)

{
  PFNGLDRAWELEMENTSPROC p_Var1;
  PFNGLUNIFORM3FVPROC p_Var2;
  PFNGLUNIFORMMATRIX4FVPROC p_Var3;
  GLint GVar4;
  socklen_t __len;
  sockaddr *__addr;
  int __fd;
  GLchar *local_120 [4];
  GLchar *local_100 [4];
  GLchar *local_e0 [4];
  allocator<char> local_c0 [144];
  
  (*glad_glEnable)(0xbe2);
  (*glad_glBlendFunc)(0x302,0x303);
  (*glad_glEnable)(0xb44);
  (*glad_glCullFace)(0x405);
  gfx::Program::use(&this->program);
  p_Var3 = glad_glUniformMatrix4fv;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_e0,"projection",local_c0);
  GVar4 = (*glad_glGetUniformLocation)((this->program).id,local_e0[0]);
  (*p_Var3)(GVar4,1,'\0',(GLfloat *)projection);
  std::__cxx11::string::~string((string *)local_e0);
  p_Var3 = glad_glUniformMatrix4fv;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_100,"view",local_c0);
  GVar4 = (*glad_glGetUniformLocation)((this->program).id,local_100[0]);
  (*p_Var3)(GVar4,1,'\0',(GLfloat *)view);
  __len = (socklen_t)view;
  std::__cxx11::string::~string((string *)local_100);
  p_Var2 = glad_glUniform3fv;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_120,"eye",local_c0);
  GVar4 = (*glad_glGetUniformLocation)((this->program).id,local_120[0]);
  __fd = 1;
  (*p_Var2)(GVar4,1,(GLfloat *)eye);
  std::__cxx11::string::~string((string *)local_120);
  gfx::VAO::bind(&this->vao,__fd,__addr,__len);
  p_Var1 = glad_glDrawElements;
  memcpy(local_c0,&DAT_00124148,0x90);
  (*p_Var1)(4,0x24,0x1405,local_c0);
  gfx::VAO::unbind(&this->vao);
  (*glad_glDisable)(0xb44);
  return;
}

Assistant:

void draw(const glm::mat4& projection, const glm::mat4& view, const glm::vec3& eye) {
        glEnable(GL_BLEND);
        glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
        glEnable(GL_CULL_FACE);
        glCullFace(GL_BACK);
        program.use();
        glUniformMatrix4fv(
            program.uniform_loc("projection"), 
            1,                                 // count
            GL_FALSE,                          // transpose
            glm::value_ptr(projection)         // pointer to data
        );
        glUniformMatrix4fv(program.uniform_loc("view"), 1, GL_FALSE, glm::value_ptr(view));
        glUniform3fv(program.uniform_loc("eye"), 1, glm::value_ptr(eye));
        vao.bind();
        glDrawElements(GL_TRIANGLES, 36, GL_UNSIGNED_INT, std::array<uint, 36>{
            0, 3, 2, 2, 1, 0, 0, 5, 4, 4, 3, 0, 0, 1, 6, 6, 5, 0, 5, 6, 7, 7,
            4, 5, 1, 2, 7, 7, 6, 1, 3, 4, 7, 7, 2, 3
        }.data());
        vao.unbind();
        glDisable(GL_CULL_FACE);
    }